

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  uint __val;
  uint uVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  ostream *poVar10;
  ssize_t sVar11;
  long *plVar12;
  uint uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__nbytes;
  size_type *psVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint __len;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_24;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_25;
  string filename;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  rules;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  string read_string;
  string token;
  string line;
  Parser parser;
  Tokenizer tokenizer;
  ParseTableCalculation table_calculation;
  vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
  table;
  allocator_type local_d6b;
  allocator_type local_d6a;
  allocator_type local_d69;
  allocator_type local_d68;
  allocator_type local_d67;
  allocator_type local_d66;
  allocator_type local_d65;
  allocator_type local_d64;
  allocator_type local_d63;
  allocator_type local_d62;
  allocator_type local_d61;
  allocator_type local_d60;
  allocator_type local_d5f;
  allocator_type local_d5e;
  allocator_type local_d5d;
  allocator_type local_d5c;
  allocator_type local_d5b;
  allocator_type local_d5a;
  allocator_type local_d59;
  allocator_type local_d58;
  allocator_type local_d57;
  allocator_type local_d56;
  allocator_type local_d55;
  allocator_type local_d54;
  allocator_type local_d53;
  allocator_type local_d52;
  allocator_type local_d51;
  char local_d50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_d48;
  string local_d40;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_d20;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0;
  undefined1 *local_cb0 [2];
  undefined1 local_ca0 [16];
  undefined1 *local_c90 [2];
  undefined1 local_c80 [16];
  undefined1 *local_c70 [2];
  undefined1 local_c60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  undefined1 *local_c30 [2];
  undefined1 local_c20 [16];
  undefined1 *local_c10 [2];
  undefined1 local_c00 [16];
  undefined1 *local_bf0 [2];
  undefined1 local_be0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  undefined1 *local_bb0 [2];
  undefined1 local_ba0 [16];
  undefined1 *local_b90 [2];
  undefined1 local_b80 [16];
  undefined1 *local_b70 [2];
  undefined1 local_b60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  undefined1 *local_b30 [2];
  undefined1 local_b20 [16];
  undefined1 *local_b10 [2];
  undefined1 local_b00 [16];
  undefined1 *local_af0 [2];
  undefined1 local_ae0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  undefined1 *local_ab0 [2];
  undefined1 local_aa0 [16];
  undefined1 *local_a90 [2];
  undefined1 local_a80 [16];
  undefined1 *local_a70 [2];
  undefined1 local_a60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  undefined1 *local_a30 [2];
  undefined1 local_a20 [16];
  undefined1 *local_a10 [2];
  undefined1 local_a00 [16];
  undefined1 *local_9f0 [2];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_970;
  undefined1 local_958 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_940;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_928;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_910;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_898;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_880;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_868;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_850;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_838;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_820;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_808;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_790;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  undefined1 *local_740 [2];
  undefined1 local_730 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  undefined1 *local_700 [2];
  undefined1 local_6f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  undefined1 *local_6c0 [2];
  undefined1 local_6b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  undefined1 *local_680 [2];
  undefined1 local_670 [16];
  undefined1 *local_660 [2];
  undefined1 local_650 [16];
  undefined1 *local_640 [2];
  undefined1 local_630 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  undefined1 *local_600 [2];
  undefined1 local_5f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  undefined1 *local_5c0 [2];
  undefined1 local_5b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  undefined1 *local_580 [2];
  undefined1 local_570 [16];
  undefined1 *local_560 [2];
  undefined1 local_550 [16];
  undefined1 *local_540 [2];
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 *local_4e0;
  undefined1 local_4d0 [8];
  undefined1 local_4c8 [8];
  undefined1 *local_4c0 [2];
  undefined1 local_4b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  undefined1 *local_470 [2];
  undefined1 local_460 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  undefined1 *local_430 [2];
  undefined1 local_420 [16];
  undefined1 *local_410 [2];
  undefined1 local_400 [16];
  undefined1 *local_3f0 [2];
  undefined1 local_3e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  undefined1 *local_3b0 [2];
  undefined1 local_3a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined1 *local_370 [2];
  undefined1 local_360 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"filename","");
  parseArguments((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_d08,&local_310,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  pcVar1 = local_9d0 + 0x10;
  local_9d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9d0,"help","");
  iVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_d08,(key_type *)local_9d0);
  if ((pointer)local_9d0._0_8_ != pcVar1) {
    operator_delete((void *)local_9d0._0_8_);
  }
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_9d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9d0,"filename","");
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&local_d08,(key_type *)local_9d0);
    if ((pointer)local_9d0._0_8_ != pcVar1) {
      operator_delete((void *)local_9d0._0_8_);
    }
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      local_9d0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9d0,"No file provided","");
      printError((string *)local_9d0);
      if ((pointer)local_9d0._0_8_ != pcVar1) {
        operator_delete((void *)local_9d0._0_8_);
      }
      iVar4 = -1;
      printHelp();
    }
    else {
      local_9d0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9d0,"tokenizer_debug","");
      iVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_d08,(key_type *)local_9d0);
      if ((pointer)local_9d0._0_8_ != pcVar1) {
        operator_delete((void *)local_9d0._0_8_);
      }
      local_9d0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9d0,"table_debug","");
      iVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_d08,(key_type *)local_9d0);
      if ((pointer)local_9d0._0_8_ != pcVar1) {
        operator_delete((void *)local_9d0._0_8_);
      }
      local_9d0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9d0,"parser_debug","");
      iVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_d08,(key_type *)local_9d0);
      if ((pointer)local_9d0._0_8_ != pcVar1) {
        operator_delete((void *)local_9d0._0_8_);
      }
      local_9d0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9d0,"debug","");
      iVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_d08,(key_type *)local_9d0);
      if ((pointer)local_9d0._0_8_ != pcVar1) {
        operator_delete((void *)local_9d0._0_8_);
      }
      local_d50 = iVar6.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur != (__node_type *)0x0 ||
                  iVar9.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur != (__node_type *)0x0;
      local_9d0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9d0,"ast","");
      local_d48._M_cur =
           (__node_type *)
           std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&local_d08,(key_type *)local_9d0);
      if ((pointer)local_9d0._0_8_ != pcVar1) {
        operator_delete((void *)local_9d0._0_8_);
      }
      local_d40._M_dataplus._M_p = (pointer)&local_d40.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d40,
                 *(long *)((long)iVar5.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                 ._M_cur + 0x28),
                 *(long *)((long)iVar5.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                 ._M_cur + 0x30) +
                 *(long *)((long)iVar5.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                 ._M_cur + 0x28));
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"program","");
      local_2d0[0] = local_2c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"commands","");
      local_2b0[0] = local_2a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"EOF","");
      __l._M_len = 3;
      __l._M_array = &local_2f0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_9d0,__l,&local_d51);
      local_520._0_8_ = local_520 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"commands","");
      local_500._0_8_ = local_500 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"command","");
      local_4e0 = local_4d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"SEMICOLON","");
      local_4c0[0] = local_4b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"commands","");
      __l_00._M_len = 4;
      __l_00._M_array = (iterator)local_520;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_9d0 + 0x18),__l_00,&local_d52);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"commands","");
      local_150[0] = local_140;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"block","");
      local_130[0] = local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"commands","");
      __l_01._M_len = 3;
      __l_01._M_array = &local_170;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_9d0 + 0x30),__l_01,&local_d53);
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"commands","");
      local_330[0] = local_320;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"");
      __l_02._M_len = 2;
      __l_02._M_array = &local_350;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_9d0 + 0x48),__l_02,&local_d54);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"command","");
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"PRINT","");
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"rvalue","");
      __l_03._M_len = 3;
      __l_03._M_array = &local_90;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_970,__l_03,&local_d55);
      local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"command","");
      local_580[0] = local_570;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"VARIABLE","");
      local_560[0] = local_550;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"ASSIGN","");
      local_540[0] = local_530;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"rvalue","");
      __l_04._M_len = 4;
      __l_04._M_array = &local_5a0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_958,__l_04,&local_d56);
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"command","");
      local_370[0] = local_360;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"function_call","");
      __l_05._M_len = 2;
      __l_05._M_array = &local_390;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_940,__l_05,&local_d57);
      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"command","");
      local_3b0[0] = local_3a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"return","");
      __l_06._M_len = 2;
      __l_06._M_array = &local_3d0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_928,__l_06,&local_d58);
      local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b50,"block","");
      local_b30[0] = local_b20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b30,"OPEN_CURLY_BRACKET","");
      local_b10[0] = local_b00;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b10,"commands","");
      local_af0[0] = local_ae0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_af0,"CLOSE_CURLY_BRACKET","");
      __l_07._M_len = 4;
      __l_07._M_array = &local_b50;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_910,__l_07,&local_d59);
      local_cd0._M_dataplus._M_p = (pointer)&local_cd0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cd0,"function","");
      local_cb0[0] = local_ca0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_cb0,"FUNCTION","");
      local_c90[0] = local_c80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"parameter_list","");
      local_c70[0] = local_c60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c70,"block","");
      __l_08._M_len = 4;
      __l_08._M_array = &local_cd0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_8f8,__l_08,&local_d5a);
      local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a50,"parameter_list","");
      local_a30[0] = local_a20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a30,"OPEN_BRACKET","");
      local_a10[0] = local_a00;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"parameters","");
      local_9f0[0] = local_9e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9f0,"CLOSE_BRACKET","");
      __l_09._M_len = 4;
      __l_09._M_array = &local_a50;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_8e0,__l_09,&local_d5b);
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"parameter_list","");
      local_1b0[0] = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"OPEN_BRACKET","");
      local_190[0] = local_180;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"CLOSE_BRACKET","");
      __l_10._M_len = 3;
      __l_10._M_array = &local_1d0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_8c8,__l_10,&local_d5c);
      local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"parameters","");
      local_ab0[0] = local_aa0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_ab0,"parameter","");
      local_a90[0] = local_a80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a90,"COMMA","");
      local_a70[0] = local_a60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a70,"parameters","");
      __l_11._M_len = 4;
      __l_11._M_array = &local_ad0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_8b0,__l_11,&local_d5d);
      local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"parameters","");
      local_5c0[0] = local_5b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"parameter","");
      __l_12._M_len = 2;
      __l_12._M_array = &local_5e0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_898,__l_12,&local_d5e);
      local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"parameter","");
      local_600[0] = local_5f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"VARIABLE","");
      __l_13._M_len = 2;
      __l_13._M_array = &local_620;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_880,__l_13,&local_d5f);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"function_call","");
      local_210[0] = local_200;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"VARIABLE","");
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"parameter_list","");
      __l_14._M_len = 3;
      __l_14._M_array = &local_230;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_868,__l_14,&local_d60);
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"return","");
      local_270[0] = local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"RETURN","");
      local_250[0] = local_240;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"rvalue","");
      __l_15._M_len = 3;
      __l_15._M_array = &local_290;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_850,__l_15,&local_d61);
      local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd0,"rvalue","");
      local_bb0[0] = local_ba0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_bb0,"rvalue","");
      local_b90[0] = local_b80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b90,"SUB","");
      local_b70[0] = local_b60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"rvalue","");
      __l_16._M_len = 4;
      __l_16._M_array = &local_bd0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_838,__l_16,&local_d62);
      local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c50,"rvalue","");
      local_c30[0] = local_c20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c30,"rvalue","");
      local_c10[0] = local_c00;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c10,"ADD","");
      local_bf0[0] = local_be0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"rvalue","");
      __l_17._M_len = 4;
      __l_17._M_array = &local_c50;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_820,__l_17,&local_d63);
      local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"rvalue","");
      local_680[0] = local_670;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"rvalue","");
      local_660[0] = local_650;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"MUL","");
      local_640[0] = local_630;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"rvalue","");
      __l_18._M_len = 4;
      __l_18._M_array = &local_6a0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_808,__l_18,&local_d64);
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"rvalue","");
      local_430[0] = local_420;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"rvalue","");
      local_410[0] = local_400;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"DIV","");
      local_3f0[0] = local_3e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"rvalue","");
      __l_19._M_len = 4;
      __l_19._M_array = &local_450;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_7f0,__l_19,&local_d65);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"rvalue","");
      local_f0[0] = local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"OPEN_BRACKET","");
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"rvalue","");
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"CLOSE_BRACKET","");
      __l_20._M_len = 4;
      __l_20._M_array = &local_110;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_7d8,__l_20,&local_d66);
      local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"rvalue","");
      local_6c0[0] = local_6b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6c0,"STRING","");
      __l_21._M_len = 2;
      __l_21._M_array = &local_6e0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_7c0,__l_21,&local_d67);
      local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"rvalue","");
      local_700[0] = local_6f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"NUMBER","");
      __l_22._M_len = 2;
      __l_22._M_array = &local_720;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_7a8,__l_22,&local_d68);
      local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"rvalue","");
      local_470[0] = local_460;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"VARIABLE","");
      __l_23._M_len = 2;
      __l_23._M_array = &local_490;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_790,__l_23,&local_d69);
      local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"rvalue","");
      local_740[0] = local_730;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"function","");
      __l_24._M_len = 2;
      __l_24._M_array = &local_760;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_778,__l_24,&local_d6a);
      __l_25._M_len = 0x1a;
      __l_25._M_array = (iterator)local_9d0;
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::vector(&local_d20,__l_25,&local_d6b);
      lVar16 = 600;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_9d0 + lVar16));
        lVar16 = lVar16 + -0x18;
      } while (lVar16 != -0x18);
      lVar16 = 0;
      do {
        if (local_730 + lVar16 != *(undefined1 **)((long)local_740 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_740 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x40);
      lVar16 = 0;
      do {
        if (local_460 + lVar16 != *(undefined1 **)((long)local_470 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_470 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x40);
      lVar16 = 0;
      do {
        if (local_6f0 + lVar16 != *(undefined1 **)((long)local_700 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_700 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x40);
      lVar16 = 0;
      do {
        if (local_6b0 + lVar16 != *(undefined1 **)((long)local_6c0 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_6c0 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x40);
      lVar16 = 0;
      do {
        if (local_a0 + lVar16 != *(undefined1 **)((long)local_b0 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_b0 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x80);
      lVar16 = 0;
      do {
        if (local_3e0 + lVar16 != *(undefined1 **)((long)local_3f0 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_3f0 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x80);
      lVar16 = 0;
      do {
        if (local_630 + lVar16 != *(undefined1 **)((long)local_640 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_640 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x80);
      lVar16 = 0;
      do {
        if (local_be0 + lVar16 != *(undefined1 **)((long)local_bf0 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_bf0 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x80);
      lVar16 = 0;
      do {
        if (local_b60 + lVar16 != *(undefined1 **)((long)local_b70 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_b70 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x80);
      lVar16 = 0;
      do {
        if (local_240 + lVar16 != *(undefined1 **)((long)local_250 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_250 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x60);
      lVar16 = 0;
      do {
        if (local_1e0 + lVar16 != *(undefined1 **)((long)local_1f0 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_1f0 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x60);
      lVar16 = 0;
      do {
        if (local_5f0 + lVar16 != *(undefined1 **)((long)local_600 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_600 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x40);
      lVar16 = 0;
      do {
        if (local_5b0 + lVar16 != *(undefined1 **)((long)local_5c0 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_5c0 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x40);
      lVar16 = 0;
      do {
        if (local_a60 + lVar16 != *(undefined1 **)((long)local_a70 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_a70 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x80);
      lVar16 = 0;
      do {
        if (local_180 + lVar16 != *(undefined1 **)((long)local_190 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_190 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x60);
      lVar16 = 0;
      do {
        if (local_9e0 + lVar16 != *(undefined1 **)((long)local_9f0 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_9f0 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x80);
      lVar16 = 0;
      do {
        if (local_c60 + lVar16 != *(undefined1 **)((long)local_c70 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_c70 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x80);
      lVar16 = 0;
      do {
        if (local_ae0 + lVar16 != *(undefined1 **)((long)local_af0 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_af0 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x80);
      lVar16 = 0;
      do {
        if (local_3a0 + lVar16 != *(undefined1 **)((long)local_3b0 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_3b0 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x40);
      lVar16 = 0;
      do {
        if (local_360 + lVar16 != *(undefined1 **)((long)local_370 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_370 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x40);
      lVar16 = 0;
      do {
        if (local_530 + lVar16 != *(undefined1 **)((long)local_540 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_540 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x80);
      lVar16 = 0;
      do {
        if (local_40 + lVar16 != *(undefined1 **)((long)local_50 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_50 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x60);
      lVar16 = 0;
      do {
        if (local_320 + lVar16 != *(undefined1 **)((long)local_330 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_330 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x40);
      lVar16 = 0;
      do {
        if (local_120 + lVar16 != *(undefined1 **)((long)local_130 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_130 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x60);
      lVar16 = 0;
      do {
        if (local_4b0 + lVar16 != *(undefined1 **)((long)local_4c0 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_4c0 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x80);
      lVar16 = 0;
      do {
        if (local_2a0 + lVar16 != *(undefined1 **)((long)local_2b0 + lVar16)) {
          operator_delete(*(undefined1 **)((long)local_2b0 + lVar16));
        }
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != -0x60);
      ParseTableCalculation::ParseTableCalculation
                ((ParseTableCalculation *)local_520,&local_d20,
                 iVar7.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                 ._M_cur != (__node_type *)0x0 ||
                 iVar9.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                 ._M_cur != (__node_type *)0x0);
      ParseTableCalculation::calculateTable
                ((vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                  *)&local_450,(ParseTableCalculation *)local_520);
      Parser::Parser((Parser *)local_9d0,&local_d20,
                     (vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                      *)&local_450,
                     iVar8.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ._M_cur != (__node_type *)0x0 ||
                     iVar9.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ._M_cur != (__node_type *)0x0);
      Tokenizer::Tokenizer((Tokenizer *)&local_5a0,&local_d40);
      local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
      local_b50._M_string_length = 0;
      local_b50.field_2._M_local_buf[0] = '\0';
      __nbytes = &local_cd0.field_2;
      local_cd0._M_string_length = 0;
      local_cd0.field_2._M_local_buf[0] = '\0';
      local_cd0._M_dataplus._M_p = (pointer)__nbytes;
      do {
        iVar4 = std::__cxx11::string::compare((char *)&local_b50);
        if (iVar4 == 0) {
          iVar4 = 0;
          if (local_d48._M_cur != (__node_type *)0x0) {
            Parser::printAST((Parser *)local_9d0);
          }
          goto LAB_00120190;
        }
        bVar3 = Tokenizer::getNextToken((Tokenizer *)&local_5a0,&local_b50,&local_cd0);
        if (local_d50 != '\0') {
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_b50._M_dataplus._M_p,
                               local_b50._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," [",2);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_cd0._M_dataplus._M_p,local_cd0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
        }
        if (!bVar3) break;
        sVar11 = Parser::read((Parser *)local_9d0,(int)&local_b50,&local_cd0,(size_t)__nbytes);
      } while ((char)sVar11 != '\0');
      iVar4 = Tokenizer::getCurrentLine((Tokenizer *)&local_5a0);
      uVar17 = iVar4 + 1;
      __val = -uVar17;
      if (0 < (int)uVar17) {
        __val = uVar17;
      }
      __len = 1;
      if (9 < __val) {
        uVar15 = (ulong)__val;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar13 = (uint)uVar15;
          if (uVar13 < 100) {
            __len = __len - 2;
            goto LAB_0011ff86;
          }
          if (uVar13 < 1000) {
            __len = __len - 1;
            goto LAB_0011ff86;
          }
          if (uVar13 < 10000) goto LAB_0011ff86;
          uVar15 = uVar15 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar13);
        __len = __len + 1;
      }
LAB_0011ff86:
      local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_a50,(char)__len - (char)((int)uVar17 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_a50._M_dataplus._M_p + (uVar17 >> 0x1f),__len,__val);
      std::operator+(&local_6a0,"An error occurred on line ",&local_a50);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_6a0);
      psVar14 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_c50.field_2._M_allocated_capacity = *psVar14;
        local_c50.field_2._8_8_ = plVar12[3];
        local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
      }
      else {
        local_c50.field_2._M_allocated_capacity = *psVar14;
        local_c50._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_c50._M_string_length = plVar12[1];
      *plVar12 = (long)psVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_c50,(ulong)local_cd0._M_dataplus._M_p);
      psVar14 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_bd0.field_2._M_allocated_capacity = *psVar14;
        local_bd0.field_2._8_8_ = plVar12[3];
        local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
      }
      else {
        local_bd0.field_2._M_allocated_capacity = *psVar14;
        local_bd0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_bd0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_bd0);
      psVar14 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_ad0.field_2._M_allocated_capacity = *psVar14;
        local_ad0.field_2._8_8_ = plVar12[3];
        local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
      }
      else {
        local_ad0.field_2._M_allocated_capacity = *psVar14;
        local_ad0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_ad0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      printError(&local_ad0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
        operator_delete(local_ad0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) {
        operator_delete(local_bd0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c50._M_dataplus._M_p != &local_c50.field_2) {
        operator_delete(local_c50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
        operator_delete(local_6a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
        operator_delete(local_a50._M_dataplus._M_p);
      }
      iVar4 = 1;
LAB_00120190:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cd0._M_dataplus._M_p != &local_cd0.field_2) {
        operator_delete(local_cd0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
        operator_delete(local_b50._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_5a0);
      std::deque<ASTNode,_std::allocator<ASTNode>_>::~deque
                ((deque<ASTNode,_std::allocator<ASTNode>_> *)(local_958 + 0x10));
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                ((_Deque_base<int,_std::allocator<int>_> *)(local_9d0 + 0x38));
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)(local_9d0 + 0x20));
      std::
      vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
      ::~vector((vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                 *)(local_9d0 + 8));
      std::
      vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
      ::~vector((vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                 *)&local_450);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_4c8);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_500);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)(local_520 + 8));
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_d20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d40._M_dataplus._M_p != &local_d40.field_2) {
        operator_delete(local_d40._M_dataplus._M_p);
      }
    }
  }
  else {
    iVar4 = 0;
    printHelp();
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_d08);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[])
{
	auto args = parseArguments("filename", argc, argv);

	if (args.find("help") != args.end())
	{
		printHelp();
		return 0;
	}

	auto it_filename = args.find("filename");
	if (it_filename == args.end())
	{
		std::cout << std::endl;
		printError("No file provided");
		printHelp();
		return -1;
	}

	bool print_tokenizer_debug = args.find("tokenizer_debug") != args.end();
	bool print_table_calculation_debug = args.find("table_debug") != args.end();
	bool print_parser_debug = args.find("parser_debug") != args.end();
	if (args.find("debug") != args.end())
	{
		print_tokenizer_debug = true;
		print_table_calculation_debug = true;
		print_parser_debug = true;
	}
	bool print_ast = args.find("ast") != args.end();
	std::string filename = it_filename->second;

	std::vector<std::vector<std::string>> rules = {
		{"program", "commands", "EOF"},
		{"commands", "command", "SEMICOLON", "commands"},
		{"commands", "block", "commands"},
		{"commands", ""},
		{"command", "PRINT", "rvalue"},
		{"command", "VARIABLE", "ASSIGN", "rvalue"},
		{"command", "function_call"},
		{"command", "return"},
		{"block", "OPEN_CURLY_BRACKET", "commands", "CLOSE_CURLY_BRACKET"},
		{"function", "FUNCTION", "parameter_list", "block"},
		{"parameter_list", "OPEN_BRACKET", "parameters", "CLOSE_BRACKET"},
		{"parameter_list", "OPEN_BRACKET", "CLOSE_BRACKET"},
		{"parameters", "parameter", "COMMA", "parameters"},
		{"parameters", "parameter"},
		{"parameter", "VARIABLE"},
		{"function_call", "VARIABLE", "parameter_list"},
		{"return", "RETURN", "rvalue"},
		{"rvalue", "rvalue", "SUB", "rvalue"},
		{"rvalue", "rvalue", "ADD", "rvalue"},
		{"rvalue", "rvalue", "MUL", "rvalue"},
		{"rvalue", "rvalue", "DIV", "rvalue"},
		{"rvalue", "OPEN_BRACKET", "rvalue", "CLOSE_BRACKET"},
		{"rvalue", "STRING"},
		{"rvalue", "NUMBER"},
		{"rvalue", "VARIABLE"},
		{"rvalue", "function"}

	};
	ParseTableCalculation table_calculation(rules, print_table_calculation_debug);
	auto table = table_calculation.calculateTable();
	Parser parser(rules, table, print_parser_debug);

	Tokenizer tokenizer(filename);
	std::string token, read_string;
	while (token != "EOF")
	{
		bool success = tokenizer.getNextToken(token, read_string);
		if (print_tokenizer_debug)
		{
			std::cout << token << " [" << read_string << "]" << std::endl;
		}
		if (success)
		{
			success = parser.read(token, read_string);
		}
		if (!success)
		{
			std::string line = std::to_string(tokenizer.getCurrentLine() + 1);
			printError("An error occurred on line " + line + " when parsing [" + read_string + "]");
			return 1;
		}
	}
	if (print_ast)
	{
		parser.printAST();
	}
	return 0;
}